

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O2

void secp256k1_fe_cmov(secp256k1_fe *r,secp256k1_fe *a,int flag)

{
  ulong uVar1;
  ulong uVar2;
  int vflag;
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  
  if ((uint)flag < 2) {
    secp256k1_fe_verify(a);
    secp256k1_fe_verify(r);
    uVar1 = (long)flag - 1;
    uVar2 = -(long)flag;
    r->n[0] = a->n[0] & uVar2 | r->n[0] & uVar1;
    r->n[1] = a->n[1] & uVar2 | r->n[1] & uVar1;
    r->n[2] = a->n[2] & uVar2 | r->n[2] & uVar1;
    r->n[3] = a->n[3] & uVar2 | r->n[3] & uVar1;
    r->n[4] = uVar2 & a->n[4] | uVar1 & r->n[4];
    if (r->magnitude < a->magnitude) {
      r->magnitude = a->magnitude;
    }
    if (a->normalized == 0) {
      r->normalized = 0;
    }
    secp256k1_fe_verify(r);
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/field_impl.h"
          ,0x15f,"test condition failed: flag == 0 || flag == 1");
  abort();
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_cmov(secp256k1_fe *r, const secp256k1_fe *a, int flag) {
    VERIFY_CHECK(flag == 0 || flag == 1);
    secp256k1_fe_verify(a);
    secp256k1_fe_verify(r);
    secp256k1_fe_impl_cmov(r, a, flag);
    if (a->magnitude > r->magnitude) r->magnitude = a->magnitude;
    if (!a->normalized) r->normalized = 0;
    secp256k1_fe_verify(r);
}